

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void envy_bios_print_mem_train(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_mem_train *peVar1;
  uint local_38;
  int local_34;
  uint local_30;
  int j;
  int i;
  uint8_t ram_cfg;
  envy_bios_mem_train *mt;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->mem).train;
  if (strap == 0) {
    local_38 = 0xff;
  }
  else {
    local_38 = (strap & 0x1c) >> 2;
  }
  if ((peVar1->offset != 0) && ((mask & 0x1000) != 0)) {
    fprintf((FILE *)out,"MEM TRAIN table at 0x%x, version %x\n",(ulong)peVar1->offset,
            (ulong)(bios->mem).train.version);
    fprintf((FILE *)out,"Training clock: %huMHz\n\n",(ulong)(bios->mem).train.mclk);
    envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->mem).train.hlen,mask);
    if ((mask & 0x80000000) != 0) {
      fprintf((FILE *)out,"\n");
    }
    fprintf((FILE *)out,"Type | ");
    for (local_30 = 0; (int)local_30 < (int)(uint)(bios->mem).train.subentries;
        local_30 = local_30 + 1) {
      if (local_30 == local_38) {
        fprintf((FILE *)out,"%2u* ",(ulong)local_30);
      }
      else {
        fprintf((FILE *)out,"%2u  ",(ulong)local_30);
      }
    }
    fprintf((FILE *)out,"\n");
    for (local_30 = 0; (int)local_30 < (int)((uint)(bios->mem).train.subentries * 4 + 6);
        local_30 = local_30 + 1) {
      fprintf((FILE *)out,"-");
    }
    fprintf((FILE *)out,"\n");
    for (local_30 = 0; (int)local_30 < (int)(uint)(bios->mem).train.entriesnum;
        local_30 = local_30 + 1) {
      fprintf((FILE *)out,"  %02hhx |",(ulong)(bios->mem).train.entries[(int)local_30].u00);
      for (local_34 = 0; local_34 < (int)(uint)(bios->mem).train.subentries; local_34 = local_34 + 1
          ) {
        fprintf((FILE *)out," %02hhx ",
                (ulong)(bios->mem).train.entries[(int)local_30].subentry[local_34]);
      }
      fprintf((FILE *)out,"\n");
      envy_bios_dump_hex(bios,out,(uint)(bios->mem).train.entries[(int)local_30].offset,
                         (uint)(bios->mem).train.rlen,mask);
      envy_bios_dump_hex(bios,out,(uint)(bios->mem).train.entries[(int)local_30].offset +
                                  (uint)(bios->mem).train.rlen,
                         (uint)(bios->mem).train.subentrylen * (uint)(bios->mem).train.subentries,
                         mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
    }
    fprintf((FILE *)out,"\n");
  }
  return;
}

Assistant:

void
envy_bios_print_mem_train(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem_train *mt = &bios->mem.train;
	uint8_t ram_cfg = strap?(strap & 0x1c) >> 2:0xff;
	int i, j;

	if (!mt->offset || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "MEM TRAIN table at 0x%x, version %x\n", mt->offset, mt->version);
	fprintf(out, "Training clock: %huMHz\n\n", mt->mclk);
	envy_bios_dump_hex(bios, out, mt->offset, mt->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	fprintf(out, "Type | ");
	for (i = 0; i < mt->subentries; i++)
		if (i == ram_cfg)
			fprintf(out, "%2u* ", i);
		else
			fprintf(out, "%2u  ", i);
	fprintf(out, "\n");
	for (i = 0; i < mt->subentries * 4 + 6; i++)
		fprintf(out,"-");
	fprintf(out, "\n");

	for (i = 0; i < mt->entriesnum; i++) {
		fprintf(out, "  %02hhx |",
			mt->entries[i].u00);

		for (j = 0; j < mt->subentries; j++) {
			fprintf(out, " %02hhx ",
				mt->entries[i].subentry[j]);
		}
		fprintf(out, "\n");

		envy_bios_dump_hex(bios, out, mt->entries[i].offset, mt->rlen, mask);
		envy_bios_dump_hex(bios, out, mt->entries[i].offset+mt->rlen, mt->subentrylen * mt->subentries, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	}

	fprintf(out, "\n");
}